

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall FOptionMenuScreenResolutionLine::Activate(FOptionMenuScreenResolutionLine *this)

{
  float volume;
  FSoundID local_14;
  FOptionMenuScreenResolutionLine *local_10;
  FOptionMenuScreenResolutionLine *this_local;
  
  local_10 = this;
  FSoundID::FSoundID(&local_14,"menu/choose");
  volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
  S_Sound(0x22,&local_14,volume,0.0);
  M_SetVideoMode();
  return true;
}

Assistant:

bool Activate()
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		M_SetVideoMode();
		return true;
	}